

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::createImageFormatTypeTilingTests
               (TestCaseGroup *testGroup,ImageFormatPropertyCase params)

{
  TestContext *testCtx;
  char *__s;
  TestNode *node;
  VkFormat value;
  allocator<char> local_91;
  string caseName;
  string local_70;
  string local_50 [32];
  
  for (value = VK_FORMAT_R4G4_UNORM_PACK8;
      value != (VK_FORMAT_ASTC_12x12_SRGB_BLOCK|VK_FORMAT_R4G4_UNORM_PACK8);
      value = value + VK_FORMAT_R4G4_UNORM_PACK8) {
    __s = ::vk::getFormatName(value);
    std::__cxx11::string::string<std::allocator<char>>(local_50,__s,&local_91);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)local_50);
    de::toLower(&caseName,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,__s,(allocator<char> *)local_50);
    testCtx = (testGroup->super_TestNode).m_testCtx;
    node = (TestNode *)operator_new(0x98);
    TestCase::TestCase((TestCase *)node,testCtx,NODETYPE_SELF_VALIDATE,&caseName,&local_70);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bcb268;
    node[1].m_testCtx = (TestContext *)execImageFormatTest;
    node[1].m_name._M_dataplus._M_p = (pointer)params.testFunction;
    node[1].m_name._M_string_length = CONCAT44(params.imageType,value);
    node[1].m_name.field_2._M_allocated_capacity = params._16_8_;
    tcu::TestNode::addChild(&testGroup->super_TestNode,node);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&caseName);
  }
  return;
}

Assistant:

void createImageFormatTypeTilingTests (tcu::TestCaseGroup* testGroup, ImageFormatPropertyCase params)
{
	DE_ASSERT(params.format == VK_FORMAT_UNDEFINED);

	for (deUint32 formatNdx = VK_FORMAT_UNDEFINED+1; formatNdx < VK_CORE_FORMAT_LAST; ++formatNdx)
	{
		const VkFormat		format			= (VkFormat)formatNdx;
		const char* const	enumName		= getFormatName(format);
		const string		caseName		= de::toLower(string(enumName).substr(10));

		params.format = format;

		addFunctionCase(testGroup, caseName, enumName, execImageFormatTest, params);
	}
}